

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v5::internal::grisu2_gen_digits
               (char *buf,int *size,uint32_t hi,uint64_t lo,int *exp,uint64_t delta,fp *one,fp *diff
               ,int max_digits)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  significand_type diff_00;
  int iVar5;
  ulong uVar6;
  char cVar7;
  uint64_t remainder;
  uint64_t exp_00;
  int iVar8;
  
  iVar8 = *exp;
  do {
    if (iVar8 < 1) {
      iVar4 = *size;
      remainder = lo;
      do {
        cVar7 = (char)(remainder * 10 >> (-(char)one->e & 0x3fU));
        iVar5 = iVar8;
        if (cVar7 != '\0' || iVar4 != 0) {
          *size = iVar4 + 1;
          buf[iVar4] = cVar7 + '0';
          iVar5 = *exp;
        }
        delta = delta * 10;
        exp_00 = one->f;
        remainder = exp_00 - 1 & remainder * 10;
        iVar8 = iVar5 + -1;
        *exp = iVar8;
      } while ((delta <= remainder) && (iVar4 = *size, iVar4 <= max_digits));
      diff_00 = (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)(1 - iVar5) * 4) *
                diff->f;
      goto LAB_001e29d2;
    }
    switch(iVar8) {
    case 1:
      uVar3 = hi;
      hi = 0;
      goto LAB_001e28e1;
    case 2:
      uVar6 = 10;
      break;
    case 3:
      uVar6 = 100;
      break;
    case 4:
      uVar6 = 1000;
      break;
    case 5:
      uVar6 = 10000;
      break;
    case 6:
      uVar6 = 100000;
      break;
    case 7:
      uVar6 = 1000000;
      break;
    case 8:
      uVar6 = 10000000;
      break;
    case 9:
      uVar3 = hi / 100000000;
      hi = hi % 100000000;
      goto LAB_001e28e1;
    case 10:
      uVar3 = hi / 1000000000;
      hi = hi % 1000000000;
      goto LAB_001e28e1;
    default:
      uVar3 = 0;
      goto LAB_001e28e1;
    }
    uVar3 = (uint)(hi / uVar6);
    hi = (uint)((ulong)hi % uVar6);
LAB_001e28e1:
    iVar4 = *size;
    if (uVar3 != 0 || iVar4 != 0) {
      *size = iVar4 + 1;
      buf[iVar4] = (char)uVar3 + '0';
      iVar8 = *exp;
    }
    iVar8 = iVar8 + -1;
    *exp = iVar8;
    bVar1 = -(char)one->e;
    remainder = ((ulong)hi << (bVar1 & 0x3f)) + lo;
    if ((remainder <= delta) || (max_digits < *size)) {
      exp_00 = (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)iVar8 * 4) <<
               (bVar1 & 0x3f);
      diff_00 = diff->f;
LAB_001e29d2:
      bVar2 = grisu2_round(buf,size,max_digits,delta,remainder,exp_00,diff_00,exp);
      return bVar2;
    }
  } while( true );
}

Assistant:

FMT_FUNC bool grisu2_gen_digits(
    char *buf, int &size, uint32_t hi, uint64_t lo, int &exp,
    uint64_t delta, const fp &one, const fp &diff, int max_digits) {
  // Generate digits for the most significant part (hi).
  while (exp > 0) {
    uint32_t digit = 0;
    // This optimization by miloyip reduces the number of integer divisions by
    // one per iteration.
    switch (exp) {
    case 10: digit = hi / 1000000000; hi %= 1000000000; break;
    case  9: digit = hi /  100000000; hi %=  100000000; break;
    case  8: digit = hi /   10000000; hi %=   10000000; break;
    case  7: digit = hi /    1000000; hi %=    1000000; break;
    case  6: digit = hi /     100000; hi %=     100000; break;
    case  5: digit = hi /      10000; hi %=      10000; break;
    case  4: digit = hi /       1000; hi %=       1000; break;
    case  3: digit = hi /        100; hi %=        100; break;
    case  2: digit = hi /         10; hi %=         10; break;
    case  1: digit = hi;              hi =           0; break;
    default:
      FMT_ASSERT(false, "invalid number of digits");
    }
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    --exp;
    uint64_t remainder = (static_cast<uint64_t>(hi) << -one.e) + lo;
    if (remainder <= delta || size > max_digits) {
      return grisu2_round(
            buf, size, max_digits, delta, remainder,
            static_cast<uint64_t>(data::POWERS_OF_10_32[exp]) << -one.e,
            diff.f, exp);
    }
  }
  // Generate digits for the least significant part (lo).
  for (;;) {
    lo *= 10;
    delta *= 10;
    char digit = static_cast<char>(lo >> -one.e);
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    lo &= one.f - 1;
    --exp;
    if (lo < delta || size > max_digits) {
      return grisu2_round(buf, size, max_digits, delta, lo, one.f,
                          diff.f * data::POWERS_OF_10_32[-exp], exp);
    }
  }
}